

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEnd)

{
  XMLDocument *pXVar1;
  MemPool *pMVar2;
  long *plVar3;
  XMLNode *addThis;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var_01;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  XMLNode *node;
  StrPair endTag;
  XMLNode *local_60;
  StrPair local_58;
  char *local_40;
  StrPair *local_38;
  undefined4 extraout_var_00;
  
  local_38 = parentEnd;
  do {
    if ((p == (char *)0x0) || (*p == '\0')) goto LAB_001a7637;
    local_60 = (XMLNode *)0x0;
    p = XMLDocument::Identify(this->_document,p,&local_60);
    addThis = local_60;
    if (local_60 == (XMLNode *)0x0) {
      iVar4 = 3;
    }
    else {
      local_58._flags = 0;
      local_58._start = (char *)0x0;
      local_58._end = (char *)0x0;
      iVar4 = (*local_60->_vptr_XMLNode[0x11])(local_60,p,&local_58);
      p = (char *)CONCAT44(extraout_var,iVar4);
      if (p == (char *)0x0) {
        pMVar2 = addThis->_memPool;
        (*addThis->_vptr_XMLNode[0xf])(addThis);
        (*pMVar2->_vptr_MemPool[4])(pMVar2,addThis);
        pXVar1 = this->_document;
        iVar4 = 3;
        if (pXVar1->_errorID == XML_NO_ERROR) {
          pXVar1->_errorID = XML_ERROR_PARSING;
          pXVar1->_errorStr1 = (char *)0x0;
          pXVar1->_errorStr2 = (char *)0x0;
        }
      }
      else {
        iVar4 = (*addThis->_vptr_XMLNode[4])(addThis);
        plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
        if ((plVar5 == (long *)0x0) ||
           (pXVar1 = this->_document, (pXVar1->super_XMLNode)._firstChild == (XMLNode *)0x0)) {
          iVar4 = (**addThis->_vptr_XMLNode)(addThis);
          plVar5 = (long *)CONCAT44(extraout_var_01,iVar4);
          if (plVar5 == (long *)0x0) {
LAB_001a7606:
            iVar4 = 0;
            InsertEndChild(this,addThis);
          }
          else {
            iVar4 = (int)plVar5[0xb];
            if (iVar4 == 2) {
              if (local_38 != (StrPair *)0x0) {
                StrPair::TransferTo((StrPair *)(plVar5 + 3),local_38);
              }
              (*addThis->_memPool->_vptr_MemPool[5])();
              pMVar2 = addThis->_memPool;
              (*addThis->_vptr_XMLNode[0xf])(addThis);
              iVar4 = 1;
              (*pMVar2->_vptr_MemPool[4])(pMVar2,addThis);
              local_40 = p;
            }
            else {
              bVar10 = iVar4 == 0 || local_58._start != local_58._end;
              if ((local_58._start != local_58._end) && (iVar4 == 0)) {
                pcVar7 = StrPair::GetStr(&local_58);
                lVar6 = (**(code **)(*plVar5 + 0x48))(plVar5);
                if (lVar6 == 0) {
                  pcVar8 = StrPair::GetStr((StrPair *)(plVar5 + 3));
                }
                else {
                  pcVar8 = (char *)0x0;
                }
                if (pcVar7 != pcVar8) {
                  bVar10 = *pcVar7 == '\0';
                  if ((bVar10) || (*pcVar7 != *pcVar8)) {
                    bVar11 = false;
                  }
                  else {
                    lVar6 = 1;
                    do {
                      lVar9 = lVar6;
                      bVar10 = pcVar7[lVar9] == '\0';
                      if ((bVar10) || (pcVar7[lVar9] != pcVar8[lVar9])) break;
                      lVar6 = lVar9 + 1;
                    } while ((int)lVar9 != 0x7fffffff);
                    bVar11 = (int)lVar9 == 0x7fffffff;
                    pcVar8 = pcVar8 + lVar9;
                  }
                  if ((!bVar11) && ((!bVar10 || (*pcVar8 != '\0')))) {
                    bVar10 = true;
                    goto LAB_001a759f;
                  }
                }
                bVar10 = false;
              }
LAB_001a759f:
              iVar4 = 0;
              if (bVar10) {
                pXVar1 = this->_document;
                lVar6 = (**(code **)(*plVar5 + 0x48))(plVar5);
                if (lVar6 == 0) {
                  pcVar7 = StrPair::GetStr((StrPair *)(plVar5 + 3));
                }
                else {
                  pcVar7 = (char *)0x0;
                }
                pXVar1->_errorID = XML_ERROR_MISMATCHED_ELEMENT;
                pXVar1->_errorStr1 = pcVar7;
                pXVar1->_errorStr2 = (char *)0x0;
                pMVar2 = addThis->_memPool;
                (*addThis->_vptr_XMLNode[0xf])(addThis);
                iVar4 = 3;
                (*pMVar2->_vptr_MemPool[4])(pMVar2,addThis);
              }
              if (!bVar10) goto LAB_001a7606;
            }
          }
        }
        else {
          lVar6 = (**(code **)(*plVar5 + 0x48))(plVar5);
          if (lVar6 == 0) {
            pcVar7 = StrPair::GetStr((StrPair *)(plVar5 + 3));
          }
          else {
            pcVar7 = (char *)0x0;
          }
          pXVar1->_errorID = XML_ERROR_PARSING_DECLARATION;
          pXVar1->_errorStr1 = pcVar7;
          pXVar1->_errorStr2 = (char *)0x0;
          plVar3 = (long *)plVar5[10];
          (**(code **)(*plVar5 + 0x78))(plVar5);
          iVar4 = 3;
          (**(code **)(*plVar3 + 0x20))(plVar3,plVar5);
        }
      }
      StrPair::~StrPair(&local_58);
    }
  } while (iVar4 == 0);
  if (iVar4 != 1) {
LAB_001a7637:
    local_40 = (char *)0x0;
  }
  return local_40;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEnd )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

    while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        if ( node == 0 ) {
            break;
        }

        StrPair endTag;
        p = node->ParseDeep( p, &endTag );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, 0, 0 );
            }
            break;
        }

        XMLDeclaration* decl = node->ToDeclaration();
        if ( decl ) {
                // A declaration can only be the first child of a document.
                // Set error, if document already has children.
                if ( !_document->NoChildren() ) {
                        _document->SetError( XML_ERROR_PARSING_DECLARATION, decl->Value(), 0);
                        DeleteNode( decl );
                        break;
                }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEnd ) {
                    ele->_value.TransferTo( parentEnd );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, ele->Name(), 0 );
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}